

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_streambuf.cpp
# Opt level: O1

ssize_t __thiscall seekable::read(seekable *this,int __fd,void *__buf,size_t __nbytes)

{
  ulong uVar1;
  pointer pcVar2;
  undefined4 in_register_00000034;
  ulong uVar3;
  void *__n;
  
  uVar1 = this->pos;
  pcVar2 = (this->dev).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar3 = (long)(this->dev).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)pcVar2;
  __n = (void *)0x0;
  if (uVar1 <= uVar3) {
    __n = (void *)(uVar3 - uVar1);
  }
  if (uVar1 + (long)__buf <= uVar3) {
    __n = __buf;
  }
  if (__n != (void *)0x0) {
    memcpy((void *)CONCAT44(in_register_00000034,__fd),pcVar2 + uVar1,(size_t)__n);
  }
  this->pos = this->pos + (long)__n;
  return (ssize_t)__n;
}

Assistant:

size_t read(char *p,size_t n)
	{
		if(n + pos > dev.size()) {
			if(pos > dev.size())
				n=0;
			else
				n=dev.size() - pos;
		}
		if(n>0)
			memcpy(p,&dev[pos],n);
		pos+=n;
		return n;
	}